

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_4,_2>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_4,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_> *dst)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_58;
  float local_38 [8];
  
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_58);
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar5 = 0;
    do {
      local_38[4] = 0.0;
      local_38[5] = 0.0;
      local_38[6] = 0.0;
      local_38[7] = 0.0;
      local_38[0] = 0.0;
      local_38[1] = 0.0;
      local_38[2] = 0.0;
      local_38[3] = 0.0;
      lVar1 = 0;
      lVar3 = 0;
      pfVar2 = local_38;
      do {
        lVar4 = 0;
        do {
          if (lVar1 == lVar4) {
            fVar6 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
          }
          else {
            fVar6 = 0.0;
          }
          *(float *)((long)pfVar2 + lVar4) = fVar6;
          lVar4 = lVar4 + 0x10;
        } while (lVar4 == 0x10);
        lVar3 = lVar3 + 1;
        pfVar2 = pfVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (lVar3 != 4);
      std::vector<tcu::Matrix<float,4,2>,std::allocator<tcu::Matrix<float,4,2>>>::
      emplace_back<tcu::Matrix<float,4,2>>
                ((vector<tcu::Matrix<float,4,2>,std::allocator<tcu::Matrix<float,4,2>>> *)dst,
                 (Matrix<float,_4,_2> *)local_38);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}